

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Err * parse(VM *vm,int pkg,char *path,char *code)

{
  int iVar1;
  Parser psr;
  FnScope local_a8;
  Parser local_90;
  
  local_90.vm = vm;
  lex_new(&local_90.lxr,vm,path,code);
  local_90.scope = (FnScope *)0x0;
  local_90.locals_count = 0;
  local_90.locals_capacity = 0x10;
  local_90.pkg = pkg;
  local_90.locals = (Local *)malloc(0x80);
  vm->err = (Err *)0x0;
  iVar1 = _setjmp((__jmp_buf_tag *)vm->guard);
  if (iVar1 == 0) {
    lex_next(&local_90.lxr);
    local_a8.fn = (local_90.vm)->pkgs[local_90.pkg].main_fn;
    local_a8.first_local = 0;
    local_a8.next_slot = 0;
    local_a8.outer_scope = (fn_scope *)0x0;
    local_90.scope = &local_a8;
    parse_block(&local_90);
    fn_emit((local_90.vm)->fns + (local_90.scope)->fn,0x20);
    local_90.scope = (FnScope *)0x0;
  }
  free(local_90.locals);
  return vm->err;
}

Assistant:

Err * parse(VM *vm, int pkg, char *path, char *code) {
	Parser psr = psr_new(vm, pkg, path, code);

	// Set up an error guard
	vm->err = NULL;
	if (!setjmp(vm->guard)) {
		parse_code(&psr);
	}

	psr_free(&psr);
	return vm->err;
}